

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O0

bool __thiscall
Clasp::SharedMinimizeData::setMode
          (SharedMinimizeData *this,MinimizeMode m,wsum_t *bound,uint32 boundSize)

{
  uint uVar1;
  size_type sVar2;
  uint *puVar3;
  wsum_t wVar4;
  wsum_t wVar5;
  __int_type_conflict1 _Var6;
  long lVar7;
  reference plVar8;
  int in_ECX;
  long in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  uint32 end_1;
  uint32 i_1;
  wsum_t d;
  wsum_t a;
  wsum_t B;
  uint32 end;
  uint32 i;
  bool ok;
  SumVec *opt;
  uint32 in_stack_ffffffffffffff6c;
  SharedMinimizeData *in_stack_ffffffffffffff70;
  __atomic_base<long> *in_stack_ffffffffffffff78;
  bool local_79;
  __atomic_base<long> *local_70;
  uint local_5c;
  uint local_3c;
  uint32 local_38;
  byte local_31;
  pod_vector<long,_std::allocator<long>_> *local_30;
  uint local_24;
  long local_20;
  
  *(undefined4 *)(in_RDI + 0x38) = in_ESI;
  if ((in_ECX != 0) && (in_RDX != 0)) {
    local_30 = (pod_vector<long,_std::allocator<long>_> *)(in_RDI + 0x10);
    local_31 = 0;
    local_20 = in_RDX;
    std::__atomic_base<unsigned_int>::operator=
              ((__atomic_base<unsigned_int> *)in_stack_ffffffffffffff78,
               (__int_type)((ulong)in_stack_ffffffffffffff70 >> 0x20));
    *(undefined4 *)(in_RDI + 0x44) = 0;
    local_38 = numRules((SharedMinimizeData *)0x1ad18f);
    puVar3 = std::min<unsigned_int>(&local_24,&local_38);
    uVar1 = *puVar3;
    local_24 = uVar1;
    for (local_3c = 0; local_3c != uVar1; local_3c = local_3c + 1) {
      lVar7 = *(long *)(local_20 + (ulong)local_3c * 8);
      wVar4 = adjust(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
      if ((wVar4 < 0) && (wVar5 = maxBound(), wVar5 + wVar4 < lVar7)) {
        local_70 = (__atomic_base<long> *)maxBound();
      }
      else {
        local_70 = (__atomic_base<long> *)(lVar7 - wVar4);
      }
      _Var6 = std::__atomic_base::operator_cast_to_long(in_stack_ffffffffffffff78);
      lVar7 = (long)local_70 - _Var6;
      if ((lVar7 < 0) && ((local_31 & 1) == 0)) {
        return false;
      }
      plVar8 = bk_lib::pod_vector<long,_std::allocator<long>_>::operator[](local_30,local_3c);
      *plVar8 = (long)local_70;
      local_79 = (local_31 & 1) != 0 || 0 < lVar7;
      local_31 = local_79;
      in_stack_ffffffffffffff78 = local_70;
    }
    local_5c = local_24;
    sVar2 = bk_lib::pod_vector<long,_std::allocator<long>_>::size(local_30);
    for (; local_5c != sVar2; local_5c = local_5c + 1) {
      wVar4 = maxBound();
      plVar8 = bk_lib::pod_vector<long,_std::allocator<long>_>::operator[](local_30,local_5c);
      *plVar8 = wVar4;
    }
  }
  return true;
}

Assistant:

bool SharedMinimizeData::setMode(MinimizeMode m, const wsum_t* bound, uint32 boundSize)  {
	mode_ = m;
	if (boundSize && bound) {
		SumVec& opt = up_[0];
		bool    ok  = false;
		gCount_     = 0;
		optGen_     = 0;
		boundSize   = std::min(boundSize, numRules());
		for (uint32 i = 0, end = boundSize; i != end; ++i) {
			wsum_t B = bound[i], a = adjust(i);
			B        = a >= 0 || (maxBound() + a) >= B ? B - a : maxBound();
			wsum_t d = B - lower_[i];
			if (d < 0 && !ok) { return false; }
			opt[i]   = B;
			ok       = ok || d > 0;
		}
		for (uint32 i = boundSize, end = (uint32)opt.size(); i != end; ++i) { opt[i] = maxBound(); }
	}
	return true;
}